

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

int __thiscall indk::Neuron::getState(Neuron *this,int64_t tT)

{
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  *__range1;
  bool bVar4;
  
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = ppVar1 == ppVar2;
  if (!bVar4) {
    bVar3 = Entry::doCheckState(ppVar1->second,tT);
    if (bVar3) {
      do {
        bVar4 = ppVar1 + 1 == ppVar2;
        if (bVar4) goto LAB_0015c056;
        bVar3 = Entry::doCheckState(ppVar1[1].second,tT);
        ppVar1 = ppVar1 + 1;
      } while (bVar3);
    }
    if (!bVar4) {
      return 0;
    }
  }
LAB_0015c056:
  return (tT < (this->t).super___atomic_base<long>._M_i) + 1;
}

Assistant:

int indk::Neuron::getState(int64_t tT) const {
    for (const auto &e: Entries) {
        if (!e.second->doCheckState(tT)) {
            return States::NotProcessed;
        }
    }
    if (tT >= t.load()) return States::Pending;
    return States::Computed;
}